

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZCompElHCurl.cpp
# Opt level: O0

void __thiscall
TPZCompElHCurl<pzshape::TPZShapeLinear>::SideShapeFunction
          (TPZCompElHCurl<pzshape::TPZShapeLinear> *this,int side,TPZVec<double> *point,
          TPZFMatrix<double> *phi,TPZFMatrix<double> *curlphi)

{
  byte bVar1;
  int iVar2;
  TPZConnect *this_00;
  TPZFMatrix<double> *phi_00;
  TPZGeoEl *gel;
  long *in_RCX;
  int in_ESI;
  long *in_RDI;
  long *in_R8;
  REAL detjac;
  TPZFNMatrix<9,_double> axes;
  TPZFNMatrix<9,_double> jacinv;
  TPZFNMatrix<9,_double> jac;
  TPZGeoElSide gelside;
  TPZFMatrix<double> curlphiref;
  TPZFMatrix<double> phiref;
  int curldim;
  int nshape;
  int sidedim;
  TPZShapeData shapedata;
  int subSide_1;
  int is_1;
  TPZGeoEl *ref;
  TPZManVector<long,_2> ids;
  int subSide;
  int is;
  TPZManVector<int,_3> ordHCurl;
  int nSideConnects;
  int nSideNodes;
  int nContainedSides;
  int connectOrder;
  int connectLocalId;
  MElementType sidetype;
  int sideDim;
  int dim;
  undefined4 in_stack_ffffffffffffc1b8;
  int in_stack_ffffffffffffc1bc;
  int in_stack_ffffffffffffc1c0;
  int in_stack_ffffffffffffc1c4;
  TPZCompEl *in_stack_ffffffffffffc1c8;
  TPZFMatrix<double> *in_stack_ffffffffffffc1d0;
  MElementType MVar3;
  TPZFNMatrix<9,_double> *in_stack_ffffffffffffc1e0;
  undefined4 in_stack_ffffffffffffc1e8;
  undefined4 in_stack_ffffffffffffc1ec;
  int in_stack_ffffffffffffc1f0;
  undefined4 in_stack_ffffffffffffc1f4;
  _func_int **in_stack_ffffffffffffc1f8;
  TPZFMatrix<double> *in_stack_ffffffffffffc200;
  undefined4 in_stack_ffffffffffffc208;
  int in_stack_ffffffffffffc20c;
  TPZFMatrix<double> *in_stack_ffffffffffffc210;
  undefined4 in_stack_ffffffffffffc218;
  int in_stack_ffffffffffffc21c;
  TPZShapeData *in_stack_ffffffffffffc228;
  int in_stack_ffffffffffffc230;
  int in_stack_ffffffffffffc234;
  TPZFMatrix<double> *in_stack_ffffffffffffc258;
  TPZFMatrix<double> *in_stack_ffffffffffffc260;
  REAL in_stack_ffffffffffffc268;
  TPZFMatrix<double> *in_stack_ffffffffffffc270;
  TPZShapeData *in_stack_ffffffffffffc380;
  TPZVec<int> *in_stack_ffffffffffffc388;
  TPZVec<long> *in_stack_ffffffffffffc390;
  TPZFMatrix<double> *in_stack_ffffffffffffc400;
  TPZFMatrix<double> *in_stack_ffffffffffffc408;
  TPZFMatrix<double> *in_stack_ffffffffffffc410;
  REAL in_stack_ffffffffffffc418;
  TPZFMatrix<double> *in_stack_ffffffffffffc420;
  size_t in_stack_ffffffffffffc5d8;
  char *in_stack_ffffffffffffc5e0;
  anon_class_4_1_ffa446b1 local_39e0;
  int local_39dc;
  int local_39d8;
  int local_39d4;
  TPZFMatrix<double> *in_stack_ffffffffffffcdc8;
  REAL *in_stack_ffffffffffffcdd0;
  TPZFMatrix<double> *in_stack_ffffffffffffcdd8;
  TPZFMatrix<double> *in_stack_ffffffffffffcde0;
  TPZVec<double> *in_stack_ffffffffffffcde8;
  TPZGeoElSide *in_stack_ffffffffffffcdf0;
  int local_dc;
  TPZVec<long> local_c8 [2];
  int local_84;
  int local_80;
  undefined4 local_7c;
  TPZVec<int> local_78;
  int local_48;
  int local_44;
  int local_40;
  uint local_3c;
  undefined4 local_38;
  MElementType local_34;
  int local_30;
  undefined4 local_2c;
  long *local_28;
  long *local_20;
  int local_c;
  
  local_2c = 1;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_c = in_ESI;
  local_30 = pztopology::TPZLine::SideDimension(0x1bd0ed5);
  local_34 = pztopology::TPZLine::Type(local_c);
  local_38 = (**(code **)(*in_RDI + 0x310))(in_RDI,local_c);
  this_00 = (TPZConnect *)(**(code **)(*in_RDI + 0xa8))(in_RDI,local_38);
  bVar1 = TPZConnect::Order(this_00);
  local_3c = (uint)bVar1;
  local_40 = pztopology::TPZLine::NContainedSides(0x1bd0f44);
  local_44 = pztopology::TPZLine::NSideNodes(local_c);
  local_48 = local_40 - local_44;
  local_7c = 0xffffffff;
  TPZManVector<int,_3>::TPZManVector
            ((TPZManVector<int,_3> *)CONCAT44(in_stack_ffffffffffffc1f4,in_stack_ffffffffffffc1f0),
             CONCAT44(in_stack_ffffffffffffc1ec,in_stack_ffffffffffffc1e8),
             (int *)in_stack_ffffffffffffc1e0);
  for (local_80 = local_44; local_80 < local_40; local_80 = local_80 + 1) {
    in_stack_ffffffffffffc234 =
         pztopology::TPZLine::ContainedSideLocId
                   (in_stack_ffffffffffffc1c0,in_stack_ffffffffffffc1bc);
    local_84 = in_stack_ffffffffffffc234;
    in_stack_ffffffffffffc230 = (**(code **)(*in_RDI + 0x338))(in_RDI,in_stack_ffffffffffffc234);
    in_stack_ffffffffffffc228 =
         (TPZShapeData *)TPZVec<int>::operator[](&local_78,(long)(local_80 - local_44));
    *(int *)in_stack_ffffffffffffc228 = in_stack_ffffffffffffc230;
  }
  TPZManVector<long,_2>::TPZManVector
            ((TPZManVector<long,_2> *)CONCAT44(in_stack_ffffffffffffc1f4,in_stack_ffffffffffffc1f0),
             CONCAT44(in_stack_ffffffffffffc1ec,in_stack_ffffffffffffc1e8),
             (long *)in_stack_ffffffffffffc1e0);
  phi_00 = (TPZFMatrix<double> *)TPZCompEl::Reference(in_stack_ffffffffffffc1c8);
  for (local_dc = 0; local_dc < local_44; local_dc = local_dc + 1) {
    in_stack_ffffffffffffc21c =
         pztopology::TPZLine::ContainedSideLocId
                   (in_stack_ffffffffffffc1c0,in_stack_ffffffffffffc1bc);
    in_stack_ffffffffffffc210 =
         (TPZFMatrix<double> *)
         TPZGeoEl::NodePtr((TPZGeoEl *)in_stack_ffffffffffffc1d0,
                           (int)((ulong)in_stack_ffffffffffffc1c8 >> 0x20));
    in_stack_ffffffffffffc20c = TPZGeoNode::Id((TPZGeoNode *)in_stack_ffffffffffffc210);
    in_stack_ffffffffffffc1f8 = (_func_int **)(long)in_stack_ffffffffffffc20c;
    in_stack_ffffffffffffc200 =
         (TPZFMatrix<double> *)TPZVec<long>::operator[](local_c8,(long)local_dc);
    (in_stack_ffffffffffffc200->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable.
    _vptr_TPZSavable = in_stack_ffffffffffffc1f8;
  }
  TPZShapeData::TPZShapeData
            ((TPZShapeData *)CONCAT44(in_stack_ffffffffffffc234,in_stack_ffffffffffffc230));
  local_39d4 = -1;
  local_39d8 = -1;
  MVar3 = local_34;
  if (local_34 == EOned) {
    TPZShapeHCurl<pzshape::TPZShapeLinear>::Initialize
              (in_stack_ffffffffffffc390,in_stack_ffffffffffffc388,in_stack_ffffffffffffc380);
    in_stack_ffffffffffffc1f0 =
         TPZShapeHCurl<pzshape::TPZShapeLinear>::NHCurlShapeF
                   ((TPZShapeData *)CONCAT44(in_stack_ffffffffffffc1c4,in_stack_ffffffffffffc1c0));
    local_39d4 = 1;
    local_39d8 = in_stack_ffffffffffffc1f0;
  }
  else if (local_34 == ETriangle) {
    TPZShapeHCurl<pzshape::TPZShapeTriang>::Initialize
              (in_stack_ffffffffffffc390,in_stack_ffffffffffffc388,in_stack_ffffffffffffc380);
    local_39d8 = TPZShapeHCurl<pzshape::TPZShapeTriang>::NHCurlShapeF
                           ((TPZShapeData *)
                            CONCAT44(in_stack_ffffffffffffc1c4,in_stack_ffffffffffffc1c0));
    local_39d4 = 2;
  }
  else if (local_34 == EQuadrilateral) {
    TPZShapeHCurl<pzshape::TPZShapeQuad>::Initialize
              (in_stack_ffffffffffffc390,in_stack_ffffffffffffc388,in_stack_ffffffffffffc380);
    local_39d8 = TPZShapeHCurl<pzshape::TPZShapeQuad>::NHCurlShapeF
                           ((TPZShapeData *)
                            CONCAT44(in_stack_ffffffffffffc1c4,in_stack_ffffffffffffc1c0));
    local_39d4 = 2;
  }
  else {
    in_stack_ffffffffffffc1e0 =
         (TPZFNMatrix<9,_double> *)
         std::operator<<((ostream *)&std::cerr,
                         "virtual void TPZCompElHCurl<pzshape::TPZShapeLinear>::SideShapeFunction(int, TPZVec<REAL> &, TPZFMatrix<REAL> &, TPZFMatrix<REAL> &) [TSHAPE = pzshape::TPZShapeLinear]"
                        );
    std::operator<<((ostream *)in_stack_ffffffffffffc1e0,"\n invalid side type.Aborting...\n");
    pzinternal::DebugStopImpl(in_stack_ffffffffffffc5e0,in_stack_ffffffffffffc5d8);
  }
  local_39e0.sidedim = local_39d4;
  iVar2 = SideShapeFunction::anon_class_4_1_ffa446b1::operator()(&local_39e0);
  local_39dc = iVar2;
  TPZFMatrix<double>::TPZFMatrix
            (in_stack_ffffffffffffc200,(int64_t)in_stack_ffffffffffffc1f8,
             CONCAT44(MVar3,in_stack_ffffffffffffc1f0));
  TPZFMatrix<double>::TPZFMatrix
            (in_stack_ffffffffffffc200,(int64_t)in_stack_ffffffffffffc1f8,
             CONCAT44(MVar3,in_stack_ffffffffffffc1f0));
  MVar3 = local_34;
  if (local_34 == EOned) {
    TPZShapeHCurl<pzshape::TPZShapeLinear>::Shape
              ((TPZVec<double> *)phi_00,
               (TPZShapeData *)CONCAT44(in_stack_ffffffffffffc21c,in_stack_ffffffffffffc218),
               in_stack_ffffffffffffc210,
               (TPZFMatrix<double> *)CONCAT44(in_stack_ffffffffffffc20c,in_stack_ffffffffffffc208));
  }
  else if (local_34 == ETriangle) {
    TPZShapeHCurl<pzshape::TPZShapeTriang>::Shape
              ((TPZVec<double> *)CONCAT44(in_stack_ffffffffffffc234,in_stack_ffffffffffffc230),
               in_stack_ffffffffffffc228,phi_00,
               (TPZFMatrix<double> *)CONCAT44(in_stack_ffffffffffffc21c,in_stack_ffffffffffffc218));
  }
  else if (local_34 == EQuadrilateral) {
    TPZShapeHCurl<pzshape::TPZShapeQuad>::Shape
              ((TPZVec<double> *)CONCAT44(in_stack_ffffffffffffc234,in_stack_ffffffffffffc230),
               in_stack_ffffffffffffc228,phi_00,
               (TPZFMatrix<double> *)CONCAT44(in_stack_ffffffffffffc21c,in_stack_ffffffffffffc218));
  }
  else {
    in_stack_ffffffffffffc1d0 =
         (TPZFMatrix<double> *)
         std::operator<<((ostream *)&std::cerr,
                         "virtual void TPZCompElHCurl<pzshape::TPZShapeLinear>::SideShapeFunction(int, TPZVec<REAL> &, TPZFMatrix<REAL> &, TPZFMatrix<REAL> &) [TSHAPE = pzshape::TPZShapeLinear]"
                        );
    std::operator<<((ostream *)in_stack_ffffffffffffc1d0,"\n invalid side type.Aborting...\n");
    pzinternal::DebugStopImpl(in_stack_ffffffffffffc5e0,in_stack_ffffffffffffc5d8);
  }
  gel = TPZCompEl::Reference(in_stack_ffffffffffffc1c8);
  TPZGeoElSide::TPZGeoElSide
            ((TPZGeoElSide *)in_stack_ffffffffffffc1d0,gel,in_stack_ffffffffffffc1c4);
  TPZFNMatrix<9,_double>::TPZFNMatrix
            (in_stack_ffffffffffffc1e0,CONCAT44(iVar2,MVar3),(int64_t)in_stack_ffffffffffffc1d0);
  TPZFNMatrix<9,_double>::TPZFNMatrix
            (in_stack_ffffffffffffc1e0,CONCAT44(iVar2,MVar3),(int64_t)in_stack_ffffffffffffc1d0);
  TPZFNMatrix<9,_double>::TPZFNMatrix
            (in_stack_ffffffffffffc1e0,CONCAT44(iVar2,MVar3),(int64_t)in_stack_ffffffffffffc1d0);
  TPZGeoElSide::Jacobian
            (in_stack_ffffffffffffcdf0,in_stack_ffffffffffffcde8,in_stack_ffffffffffffcde0,
             in_stack_ffffffffffffcdd8,in_stack_ffffffffffffcdd0,in_stack_ffffffffffffcdc8);
  (**(code **)(*local_20 + 0x70))(local_20,(long)local_39d8,3);
  (**(code **)(*local_28 + 0x70))(local_28,(long)local_39dc,(long)local_39d8);
  TransformShape(in_stack_ffffffffffffc420,in_stack_ffffffffffffc418,in_stack_ffffffffffffc410,
                 in_stack_ffffffffffffc408,in_stack_ffffffffffffc400);
  iVar2 = local_30;
  if (local_30 == 1) {
    TransformCurl<1>(in_stack_ffffffffffffc1d0,(REAL)gel,
                     (TPZFMatrix<double> *)CONCAT44(1,in_stack_ffffffffffffc1c0),
                     (TPZFMatrix<double> *)
                     CONCAT44(in_stack_ffffffffffffc1bc,in_stack_ffffffffffffc1b8));
  }
  else if (local_30 == 2) {
    TransformCurl<2>(in_stack_ffffffffffffc1d0,(REAL)gel,
                     (TPZFMatrix<double> *)CONCAT44(2,in_stack_ffffffffffffc1c0),
                     (TPZFMatrix<double> *)
                     CONCAT44(in_stack_ffffffffffffc1bc,in_stack_ffffffffffffc1b8));
  }
  else if (local_30 == 3) {
    TransformCurl<3>(in_stack_ffffffffffffc270,in_stack_ffffffffffffc268,in_stack_ffffffffffffc260,
                     in_stack_ffffffffffffc258);
  }
  TPZFNMatrix<9,_double>::~TPZFNMatrix((TPZFNMatrix<9,_double> *)0x1bd1706);
  TPZFNMatrix<9,_double>::~TPZFNMatrix((TPZFNMatrix<9,_double> *)0x1bd1713);
  TPZFNMatrix<9,_double>::~TPZFNMatrix((TPZFNMatrix<9,_double> *)0x1bd1720);
  TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x1bd172d);
  TPZFMatrix<double>::~TPZFMatrix((TPZFMatrix<double> *)0x1bd173a);
  TPZFMatrix<double>::~TPZFMatrix((TPZFMatrix<double> *)0x1bd1747);
  TPZShapeData::~TPZShapeData((TPZShapeData *)CONCAT44(iVar2,in_stack_ffffffffffffc1c0));
  TPZManVector<long,_2>::~TPZManVector
            ((TPZManVector<long,_2> *)CONCAT44(iVar2,in_stack_ffffffffffffc1c0));
  TPZManVector<int,_3>::~TPZManVector
            ((TPZManVector<int,_3> *)CONCAT44(iVar2,in_stack_ffffffffffffc1c0));
  return;
}

Assistant:

void TPZCompElHCurl<TSHAPE>::SideShapeFunction(int side,TPZVec<REAL> &point,TPZFMatrix<REAL> &phi,TPZFMatrix<REAL> &curlphi)
{
    constexpr int dim = TSHAPE::Dimension;
    const int sideDim = TSHAPE::SideDimension(side);
    const MElementType sidetype = TSHAPE::Type(side);
#ifdef PZDEBUG
    if(side >= TSHAPE::NSides || side < TSHAPE::NCornerNodes){
        PZError<<__PRETTY_FUNCTION__<<"\n";
        PZError<<"There is no side shape associated to this side"<<"\n";
        DebugStop();
    }
	if( sideDim != point.size() ){
        PZError<<__PRETTY_FUNCTION__<<"\n";
        PZError<<"Wrong dimension of point! point dim: "<<point.size()<<"\tside dim: "<<sideDim<<"\n";
		return ;
	}
#endif

    const int connectLocalId = this->MidSideConnectLocId(side);
    const int connectOrder = this->Connect(connectLocalId).Order();
    const int nContainedSides = TSHAPE::NContainedSides(side);
    const int nSideNodes = TSHAPE::NSideNodes(side);
    const int nSideConnects = nContainedSides - nSideNodes;
    //vector with the connect order for each side of dim >=1 contained in side
    TPZManVector<int,TSHAPE::NSides> ordHCurl(nSideConnects,-1);
    for (auto is=nSideNodes; is< nContainedSides; is++) {
        const int subSide = TSHAPE::ContainedSideLocId(side,is);
        ordHCurl[is-nSideNodes] = this->EffectiveSideOrder(subSide);
    }
    
    TPZManVector<int64_t,TSHAPE::NCornerNodes> ids(nSideNodes,0);
    TPZGeoEl *ref = this->Reference();
    for (auto is=0; is< nSideNodes; is++) {
        const int subSide = TSHAPE::ContainedSideLocId(side,is);
        ids[is] = ref->NodePtr(subSide)->Id();
    }

    TPZShapeData shapedata;

    
    int sidedim{-1};
    int nshape{-1};
    switch(sidetype){
    case EOned:
        TPZShapeHCurl<pzshape::TPZShapeLinear>::Initialize(ids,ordHCurl,shapedata);
        nshape = TPZShapeHCurl<pzshape::TPZShapeLinear>::NHCurlShapeF(shapedata);
        sidedim = 1;
        break;
    case ETriangle:
        TPZShapeHCurl<pzshape::TPZShapeTriang>::Initialize(ids,ordHCurl,shapedata);
        nshape = TPZShapeHCurl<pzshape::TPZShapeTriang>::NHCurlShapeF(shapedata);
        sidedim = 2;
        break;
    case EQuadrilateral:
        TPZShapeHCurl<pzshape::TPZShapeQuad>::Initialize(ids,ordHCurl,shapedata);
        nshape = TPZShapeHCurl<pzshape::TPZShapeQuad>::NHCurlShapeF(shapedata);
        sidedim = 2;
        break;
    default:
        PZError<<__PRETTY_FUNCTION__
               <<"\n invalid side type.Aborting...\n";
        DebugStop();
    }

    const int curldim = [sidedim](){
        if (sidedim == 1) return 1;
        else{
            return 2*sidedim - 3;//1 for 2D 3 for 3D
        }
    }();
    
    TPZFMatrix<REAL> phiref(sidedim,nshape);
    TPZFMatrix<REAL> curlphiref(curldim,nshape);
    
    switch(sidetype){
    case EOned:
        TPZShapeHCurl<pzshape::TPZShapeLinear>::Shape(point, shapedata, phiref, curlphiref);
        break;
    case ETriangle:
        TPZShapeHCurl<pzshape::TPZShapeTriang>::Shape(point, shapedata, phiref, curlphiref);
        break;
    case EQuadrilateral:
        TPZShapeHCurl<pzshape::TPZShapeQuad>::Shape(point, shapedata, phiref, curlphiref);
        break;
    default:
        PZError<<__PRETTY_FUNCTION__
               <<"\n invalid side type.Aborting...\n";
        DebugStop();
    }

    //get the jacobian of the side transformation
    TPZGeoElSide gelside = TPZGeoElSide(this->Reference(),side);
    TPZFNMatrix<9,REAL> jac(sideDim,sideDim),jacinv(sideDim,sideDim),axes(sideDim,3);
    REAL detjac = 0;
    gelside.Jacobian(point, jac, axes, detjac, jacinv);


    phi.Redim(nshape,3);
    curlphi.Redim(curldim,nshape);
    
    TransformShape(phiref, detjac, jacinv, axes, phi);
    switch(sideDim){
    case 1:
        TransformCurl<1>(curlphiref, detjac, jac, curlphi);
        break;
    case 2:
        TransformCurl<2>(curlphiref, detjac, jac, curlphi);
        break;
    case 3:
        TransformCurl<3>(curlphiref, detjac, jac, curlphi);
        break;
    }
    
    
}